

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__shiftsigned(int v,int shift,int bits)

{
  undefined4 local_1c;
  undefined4 local_18;
  int z;
  int result;
  int bits_local;
  int shift_local;
  int v_local;
  
  if (shift < 0) {
    bits_local = v << (-(byte)shift & 0x1f);
  }
  else {
    bits_local = v >> ((byte)shift & 0x1f);
  }
  local_18 = bits_local;
  for (local_1c = bits; local_1c < 8; local_1c = bits + local_1c) {
    local_18 = (bits_local >> ((byte)local_1c & 0x1f)) + local_18;
  }
  return local_18;
}

Assistant:

static int stbi__shiftsigned(int v, int shift, int bits)
{
   int result;
   int z=0;

   if (shift < 0) v <<= -shift;
   else v >>= shift;
   result = v;

   z = bits;
   while (z < 8) {
      result += v >> z;
      z += bits;
   }
   return result;
}